

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_61d64::data<Imath_3_2::half>::checkValues
          (data<Imath_3_2::half> *this,
          vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *data,Box2i *dw,
          bool dontbothercheckingdepth)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  void *pvVar9;
  size_type sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  byte in_CL;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  float fVar12;
  float fVar13;
  double dVar14;
  size_t i_1;
  size_t i;
  size_t channel;
  size_t pel;
  size_t size;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffef8;
  ulong local_60;
  ulong local_50;
  size_type local_48;
  size_type local_40;
  int local_34;
  int local_30;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_fffffffffffffef8);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_fffffffffffffef8);
  uVar3 = sVar2 + (long)((local_30 + 1) * (local_34 + 1));
  local_40 = 0;
  local_48 = 0;
  if ((in_CL & 1) == 0) {
    for (local_60 = 0; local_60 < uVar3; local_60 = local_60 + 1) {
      pvVar4 = std::
               vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
               ::operator[]((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                             *)(in_RDI + 2),local_40);
      std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[](pvVar4,local_48);
      fVar12 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
      std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[](in_RSI,local_60);
      fVar13 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
      dVar14 = std::fabs((double)(ulong)(uint)(fVar12 - fVar13));
      if (0.005 < SUB84(dVar14,0)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"sample ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_60);
        poVar5 = std::operator<<(poVar5," (channel ");
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](in_RDI,local_48);
        poVar5 = std::operator<<(poVar5,(string *)pvVar6);
        poVar5 = std::operator<<(poVar5," of pixel ");
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_60 % sVar2);
        std::operator<<(poVar5,") ");
        poVar5 = std::operator<<((ostream *)&std::cout,"doesn\'t match expected value (channel ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_48);
        poVar5 = std::operator<<(poVar5," of pixel ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_40);
        std::operator<<(poVar5,") : ");
        poVar5 = std::operator<<((ostream *)&std::cout,"got ");
        pvVar7 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                           (in_RSI,local_60);
        poVar5 = (ostream *)::operator<<(poVar5,(half)pvVar7->_h);
        poVar5 = std::operator<<(poVar5," expected ");
        pvVar4 = std::
                 vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                 ::operator[]((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                               *)(in_RDI + 2),local_40);
        pvVar8 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                           (pvVar4,local_48);
        pvVar9 = (void *)::operator<<(poVar5,(half)pvVar8->_h);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      }
      pvVar4 = std::
               vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
               ::operator[]((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                             *)(in_RDI + 2),local_40);
      std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[](pvVar4,local_48);
      fVar12 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
      std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[](in_RSI,local_60);
      fVar13 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
      dVar14 = std::fabs((double)(ulong)(uint)(fVar12 - fVar13));
      if (0.005 < SUB84(dVar14,0)) {
        __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                      ,0x17e,
                      "void (anonymous namespace)::data<Imath_3_2::half>::checkValues(const vector<T> &, const Box2i &, bool) [T = Imath_3_2::half]"
                     );
      }
      local_48 = local_48 + 1;
      sVar2 = local_48;
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(in_RDI);
      if (sVar2 == sVar10) {
        local_48 = 0;
        local_40 = local_40 + 1;
        in_stack_fffffffffffffef0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
        pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                  ::size((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                          *)(in_RDI + 2));
        if (in_stack_fffffffffffffef0 == pbVar11) {
          local_40 = 0;
        }
      }
    }
  }
  else {
    for (local_50 = 0; local_50 < uVar3; local_50 = local_50 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,local_48);
      bVar1 = std::operator!=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,local_48);
        bVar1 = std::operator!=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        if (bVar1) {
          pvVar4 = std::
                   vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                   ::operator[]((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                 *)(in_RDI + 2),local_40);
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                    (pvVar4,local_48);
          fVar12 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                    (in_RSI,local_50);
          fVar13 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
          dVar14 = std::fabs((double)(ulong)(uint)(fVar12 - fVar13));
          if (0.005 < SUB84(dVar14,0)) {
            poVar5 = std::operator<<((ostream *)&std::cout,"sample ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_50);
            poVar5 = std::operator<<(poVar5," (channel ");
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](in_RDI,local_48);
            poVar5 = std::operator<<(poVar5,(string *)pvVar6);
            poVar5 = std::operator<<(poVar5," of pixel ");
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(in_RDI);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_50 % sVar2);
            std::operator<<(poVar5,") ");
            poVar5 = std::operator<<((ostream *)&std::cout,"doesn\'t match expected value (channel "
                                    );
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_48);
            poVar5 = std::operator<<(poVar5," of pixel ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_40);
            std::operator<<(poVar5,") : ");
            poVar5 = std::operator<<((ostream *)&std::cout,"got ");
            pvVar7 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                               (in_RSI,local_50);
            poVar5 = (ostream *)::operator<<(poVar5,(half)pvVar7->_h);
            poVar5 = std::operator<<(poVar5," expected ");
            pvVar4 = std::
                     vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                     ::operator[]((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                   *)(in_RDI + 2),local_40);
            pvVar8 = std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                               (pvVar4,local_48);
            pvVar9 = (void *)::operator<<(poVar5,(half)pvVar8->_h);
            std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
          }
          pvVar4 = std::
                   vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                   ::operator[]((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                 *)(in_RDI + 2),local_40);
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                    (pvVar4,local_48);
          fVar12 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::operator[]
                    (in_RSI,local_50);
          fVar13 = Imath_3_2::half::operator_cast_to_float((half *)in_stack_fffffffffffffef0);
          dVar14 = std::fabs((double)(ulong)(uint)(fVar12 - fVar13));
          if (0.005 < SUB84(dVar14,0)) {
            __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                          ,0x166,
                          "void (anonymous namespace)::data<Imath_3_2::half>::checkValues(const vector<T> &, const Box2i &, bool) [T = Imath_3_2::half]"
                         );
          }
        }
      }
      local_48 = local_48 + 1;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI);
      if (local_48 == sVar2) {
        local_48 = 0;
        local_40 = local_40 + 1;
        sVar2 = std::
                vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                ::size((vector<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                        *)(in_RDI + 2));
        if (local_40 == sVar2) {
          local_40 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void checkValues (
        const vector<T>& data, const Box2i& dw, bool dontbothercheckingdepth)
    {
        size_t size =
            _channels.size () + (dw.size ().x + 1) * (dw.size ().y + 1);
        size_t pel     = 0;
        size_t channel = 0;
        if (dontbothercheckingdepth)
        {
            for (size_t i = 0; i < size; i++)
            {
                if (_channels[channel] != "Z" && _channels[channel] != "ZBack")
                {
                    if (fabs (_results[pel][channel] - data[i]) > 0.005)
                    {
                        cout << "sample " << i << " (channel "
                             << _channels[channel] << " of pixel "
                             << i % _channels.size () << ") ";
                        cout << "doesn't match expected value (channel "
                             << channel << " of pixel " << pel << ") : ";
                        cout << "got " << data[i] << " expected "
                             << _results[pel][channel] << endl;
                    }
                    assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                }
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
        else
        {
            for (size_t i = 0; i < size; i++)
            {
                if (fabs (_results[pel][channel] - data[i]) > 0.005)
                {
                    cout << "sample " << i << " (channel " << _channels[channel]
                         << " of pixel " << i % _channels.size () << ") ";
                    cout << "doesn't match expected value (channel " << channel
                         << " of pixel " << pel << ") : ";
                    cout << "got " << data[i] << " expected "
                         << _results[pel][channel] << endl;
                }
                assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
    }